

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall tetgenio::save_poly(tetgenio *this,char *filebasename)

{
  facet *pfVar1;
  uint *puVar2;
  facet *pfVar3;
  polygon *ppVar4;
  double *pdVar5;
  FILE *__stream;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  char outpolyfilename [1024];
  char local_438 [1032];
  
  sprintf(local_438,"%s.poly",filebasename);
  printf("Saving poly to %s\n",local_438);
  __stream = fopen(local_438,"w");
  fprintf(__stream,"%d  %d  %d  %d\n",0,(ulong)(uint)this->mesh_dim,
          (ulong)(uint)this->numberofpointattributes,(ulong)(this->pointmarkerlist != (int *)0x0));
  if (this->mesh_dim == 2) {
    fprintf(__stream,"%d  %d\n",(ulong)(uint)this->numberofedges,
            (ulong)(this->edgemarkerlist != (int *)0x0));
    if (0 < this->numberofedges) {
      lVar7 = 0;
      do {
        fprintf(__stream,"%d  %4d  %4d",(ulong)(uint)(this->firstnumber + (int)lVar7),
                (ulong)(uint)this->edgelist[lVar7 * 2],(ulong)(uint)this->edgelist[lVar7 * 2 + 1]);
        if (this->edgemarkerlist != (int *)0x0) {
          fprintf(__stream,"  %d",(ulong)(uint)this->edgemarkerlist[lVar7]);
        }
        fputc(10,__stream);
        lVar7 = lVar7 + 1;
      } while (lVar7 < this->numberofedges);
    }
  }
  else {
    fprintf(__stream,"%d  %d\n",(ulong)(uint)this->numberoffacets,
            (ulong)(this->facetmarkerlist != (int *)0x0));
    if (0 < this->numberoffacets) {
      lVar7 = 0;
      do {
        uVar9 = 0;
        if (this->facetmarkerlist != (int *)0x0) {
          uVar9 = (ulong)(uint)this->facetmarkerlist[lVar7];
        }
        pfVar3 = this->facetlist;
        pfVar1 = pfVar3 + lVar7;
        fprintf(__stream,"%d  %d  %d  # %d\n",(ulong)(uint)pfVar3[lVar7].numberofpolygons,
                (ulong)(uint)pfVar3[lVar7].numberofholes,uVar9,
                (ulong)(uint)(this->firstnumber + (int)lVar7));
        if (0 < pfVar1->numberofpolygons) {
          lVar10 = 0;
          do {
            ppVar4 = pfVar1->polygonlist;
            fprintf(__stream,"%d  ",(ulong)(uint)ppVar4[lVar10].numberofvertices);
            if (0 < ppVar4[lVar10].numberofvertices) {
              uVar9 = 1;
              lVar8 = 0;
              do {
                if ((int)(uVar9 / 10) * 10 + -1 == (int)lVar8) {
                  fwrite("\n  ",3,1,__stream);
                }
                puVar2 = (uint *)(ppVar4[lVar10].vertexlist + lVar8);
                lVar8 = lVar8 + 1;
                fprintf(__stream,"  %d",(ulong)*puVar2);
                uVar9 = (ulong)((int)uVar9 + 1);
              } while (lVar8 < ppVar4[lVar10].numberofvertices);
            }
            fputc(10,__stream);
            lVar10 = lVar10 + 1;
          } while (lVar10 < pfVar1->numberofpolygons);
        }
        if (0 < pfVar1->numberofholes) {
          lVar10 = 0x10;
          lVar8 = 0;
          do {
            pdVar5 = pfVar1->holelist;
            fprintf(__stream,"%d  %.12g  %.12g  %.12g\n",
                    *(undefined8 *)((long)pdVar5 + lVar10 + -0x10),
                    *(undefined8 *)((long)pdVar5 + lVar10 + -8),
                    *(undefined8 *)((long)pdVar5 + lVar10),
                    (ulong)(uint)(this->firstnumber + (int)lVar8));
            lVar8 = lVar8 + 1;
            lVar10 = lVar10 + 0x18;
          } while (lVar8 < pfVar1->numberofholes);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < this->numberoffacets);
    }
  }
  fprintf(__stream,"%d\n",(ulong)(uint)this->numberofholes);
  if (0 < this->numberofholes) {
    lVar7 = 0x10;
    lVar10 = 0;
    do {
      lVar8 = (long)this->mesh_dim * (long)(int)lVar10;
      fprintf(__stream,"%d  %.12g  %.12g",this->holelist[lVar8],this->holelist[lVar8 + 1],
              (ulong)(uint)(this->firstnumber + (int)lVar10));
      if (this->mesh_dim == 3) {
        fprintf(__stream,"  %.12g",*(undefined8 *)((long)this->holelist + lVar7));
      }
      fputc(10,__stream);
      lVar10 = lVar10 + 1;
      lVar7 = lVar7 + 0x18;
    } while (lVar10 < this->numberofholes);
  }
  fprintf(__stream,"%d\n",(ulong)(uint)this->numberofregions);
  if (0 < this->numberofregions) {
    lVar7 = 0;
    lVar8 = 0;
    lVar10 = 0;
    do {
      lVar6 = (ulong)(uint)this->firstnumber + lVar10;
      pdVar5 = this->regionlist;
      if (this->mesh_dim == 2) {
        fprintf(__stream,"%d  %.12g  %.12g  %.12g  %.12g\n",*(undefined8 *)((long)pdVar5 + lVar7),
                *(undefined8 *)((long)pdVar5 + lVar7 + 8),
                *(undefined8 *)((long)pdVar5 + lVar7 + 0x10),
                *(undefined8 *)((long)pdVar5 + lVar7 + 0x18),lVar6);
      }
      else {
        fprintf(__stream,"%d  %.12g  %.12g  %.12g  %.12g  %.12g\n",
                *(undefined8 *)((long)pdVar5 + lVar8),*(undefined8 *)((long)pdVar5 + lVar8 + 8),
                *(undefined8 *)((long)pdVar5 + lVar8 + 0x10),
                *(undefined8 *)((long)pdVar5 + lVar8 + 0x18),
                *(undefined8 *)((long)pdVar5 + lVar8 + 0x20),lVar6);
      }
      lVar10 = lVar10 + 1;
      lVar8 = lVar8 + 0x28;
      lVar7 = lVar7 + 0x20;
    } while (lVar10 < this->numberofregions);
  }
  fclose(__stream);
  return;
}

Assistant:

void tetgenio::save_poly(char* filebasename)
{
  FILE *fout;
  facet *f;
  polygon *p;
  char outpolyfilename[FILENAMESIZE];
  int i, j, k;

  sprintf(outpolyfilename, "%s.poly", filebasename);
  printf("Saving poly to %s\n", outpolyfilename);
  fout = fopen(outpolyfilename, "w");

  // The zero indicates that the vertices are in a separate .node file.
  //   Followed by number of dimensions, number of vertex attributes,
  //   and number of boundary markers (zero or one).
  fprintf(fout, "%d  %d  %d  %d\n", 0, mesh_dim, numberofpointattributes,
          pointmarkerlist != NULL ? 1 : 0);

  // Save segments or facets.
  if (mesh_dim == 2) {
    // Number of segments, number of boundary markers (zero or one).
    fprintf(fout, "%d  %d\n", numberofedges, edgemarkerlist != NULL ? 1 : 0);
    for (i = 0; i < numberofedges; i++) {
      fprintf(fout, "%d  %4d  %4d", i + firstnumber, edgelist[i * 2],
              edgelist[i * 2 + 1]);
      if (edgemarkerlist != NULL) {
        fprintf(fout, "  %d", edgemarkerlist[i]);
      }
      fprintf(fout, "\n");
    }
  } else {
    // Number of facets, number of boundary markers (zero or one).
    fprintf(fout, "%d  %d\n", numberoffacets, facetmarkerlist != NULL ? 1 : 0);
    for (i = 0; i < numberoffacets; i++) {
      f = &(facetlist[i]);
      fprintf(fout, "%d  %d  %d  # %d\n", f->numberofpolygons,f->numberofholes,
            facetmarkerlist != NULL ? facetmarkerlist[i] : 0, i + firstnumber);
      // Output polygons of this facet.
      for (j = 0; j < f->numberofpolygons; j++) {
        p = &(f->polygonlist[j]);
        fprintf(fout, "%d  ", p->numberofvertices);
        for (k = 0; k < p->numberofvertices; k++) {
          if (((k + 1) % 10) == 0) {
            fprintf(fout, "\n  ");
          }
          fprintf(fout, "  %d", p->vertexlist[k]);
        }
        fprintf(fout, "\n");
      }
      // Output holes of this facet.
      for (j = 0; j < f->numberofholes; j++) {
        fprintf(fout, "%d  %.12g  %.12g  %.12g\n", j + firstnumber,
           f->holelist[j * 3], f->holelist[j * 3 + 1], f->holelist[j * 3 + 2]);
      }
    }
  }

  // Save holes.
  fprintf(fout, "%d\n", numberofholes);
  for (i = 0; i < numberofholes; i++) {
    // Output x, y coordinates.
    fprintf(fout, "%d  %.12g  %.12g", i + firstnumber, holelist[i * mesh_dim],
            holelist[i * mesh_dim + 1]);
    if (mesh_dim == 3) {
      // Output z coordinate.
      fprintf(fout, "  %.12g", holelist[i * mesh_dim + 2]);
    }
    fprintf(fout, "\n");
  }

  // Save regions.
  fprintf(fout, "%d\n", numberofregions);
  for (i = 0; i < numberofregions; i++) {
    if (mesh_dim == 2) {
      // Output the index, x, y coordinates, attribute (region number)
      //   and maximum area constraint (maybe -1).
      fprintf(fout, "%d  %.12g  %.12g  %.12g  %.12g\n", i + firstnumber,
              regionlist[i * 4], regionlist[i * 4 + 1],
              regionlist[i * 4 + 2], regionlist[i * 4 + 3]);
    } else {
      // Output the index, x, y, z coordinates, attribute (region number)
      //   and maximum volume constraint (maybe -1).
      fprintf(fout, "%d  %.12g  %.12g  %.12g  %.12g  %.12g\n", i + firstnumber,
              regionlist[i * 5], regionlist[i * 5 + 1],
              regionlist[i * 5 + 2], regionlist[i * 5 + 3],
              regionlist[i * 5 + 4]);
    }
  }

  fclose(fout);  
}